

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

void __thiscall
Catch::anon_unknown_26::TapAssertionPrinter::printRemainingMessages
          (TapAssertionPrinter *this,Code colour)

{
  pointer pMVar1;
  MessageInfo *pMVar2;
  ostream *poVar3;
  pointer pMVar4;
  char local_59;
  undefined1 local_58 [16];
  size_type local_48;
  ColourGuard local_40;
  
  pMVar4 = (this->itMessage)._M_current;
  pMVar1 = (this->messages->
           super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pMVar4 != pMVar1) {
    poVar3 = this->stream;
    local_40.m_colourImpl = this->colourImpl;
    local_40.m_engaged = false;
    local_40.m_code = colour;
    ColourImpl::ColourGuard::engageImpl(&local_40,poVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," with ",6);
    local_58._0_8_ = ((long)pMVar1 - (long)pMVar4 >> 3) * -0x71c71c71c71c71c7;
    local_58._8_8_ = "message";
    local_48 = 7;
    operator<<(poVar3,(pluralise *)local_58);
    local_59 = ':';
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_59,1);
    if (local_40.m_engaged == true) {
      (*(local_40.m_colourImpl)->_vptr_ColourImpl[2])(local_40.m_colourImpl,0);
    }
    pMVar4 = (this->itMessage)._M_current;
    if (pMVar4 != pMVar1) {
      do {
        if ((this->printInfoMessages != false) || (pMVar4->type != Info)) {
          poVar3 = this->stream;
          std::__ostream_insert<char,std::char_traits<char>>(poVar3," \'",2);
          pMVar2 = (this->itMessage)._M_current;
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar3,(pMVar2->message)._M_dataplus._M_p,
                              (pMVar2->message)._M_string_length);
          local_58[0] = 0x27;
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_58,1);
          pMVar4 = (this->itMessage)._M_current + 1;
          (this->itMessage)._M_current = pMVar4;
          if (pMVar4 != pMVar1) {
            poVar3 = this->stream;
            local_58._0_8_ = this->colourImpl;
            local_58._8_5_ = 0x17;
            ColourImpl::ColourGuard::engageImpl((ColourGuard *)local_58,poVar3);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3," and",4);
            if (local_58[0xc] == true) {
              (*(*(_func_int ***)local_58._0_8_)[2])(local_58._0_8_,0);
            }
            pMVar4 = (this->itMessage)._M_current;
          }
        }
      } while (pMVar4 != pMVar1);
    }
  }
  return;
}

Assistant:

void printRemainingMessages(Colour::Code colour = tapDimColour) {
                if (itMessage == messages.end()) {
                    return;
                }

                // using messages.end() directly (or auto) yields compilation error:
                std::vector<MessageInfo>::const_iterator itEnd = messages.end();
                const std::size_t N = static_cast<std::size_t>(itEnd - itMessage);

                stream << colourImpl->guardColour( colour ) << " with "
                       << pluralise( N, "message"_sr ) << ':';

                for (; itMessage != itEnd; ) {
                    // If this assertion is a warning ignore any INFO messages
                    if (printInfoMessages || itMessage->type != ResultWas::Info) {
                        stream << " '" << itMessage->message << '\'';
                        if (++itMessage != itEnd) {
                            stream << colourImpl->guardColour(tapDimColour) << " and";
                        }
                    }
                }
            }